

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

TextureFormat sglr::mapInternalFormat(deUint32 internalFormat)

{
  TextureFormat TStack_10;
  deUint32 internalFormat_local;
  
  switch(internalFormat) {
  case 0x1906:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,A,UNORM_INT8);
    break;
  case 0x1907:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT8);
    break;
  case 0x1908:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
    break;
  case 0x1909:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,L,UNORM_INT8);
    break;
  case 0x190a:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,LA,UNORM_INT8);
    break;
  default:
    TStack_10 = glu::mapGLInternalFormat(internalFormat);
  }
  return TStack_10;
}

Assistant:

static tcu::TextureFormat mapInternalFormat (deUint32 internalFormat)
{
	switch (internalFormat)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		TextureFormat::UNORM_INT8);
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);

		default:
			return glu::mapGLInternalFormat(internalFormat);
	}
}